

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void swrenderer::R_InitShadeMaps(void)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int k;
  byte bVar10;
  
  puVar1 = &shadetables;
  iVar2 = 0x20;
  iVar3 = 0x10;
  lVar6 = 0;
  do {
    lVar7 = lVar6 * 0x20;
    *(undefined4 *)(&DAT_00757208 + lVar7) = 0xffffffff;
    *(undefined4 *)(&DAT_00757210 + lVar7) = 0xffffffff;
    *(undefined8 *)(&DAT_00757218 + lVar7) = 0;
    (&ShadeFakeColormap)[lVar6 * 4] = puVar1;
    uVar8 = 0x2000;
    iVar9 = 0;
    do {
      iVar4 = (int)(uVar8 >> 5);
      uVar5 = iVar2 * iVar4 + 0x100;
      lVar7 = 0;
      do {
        bVar10 = (byte)(uVar5 >> 0xe);
        if (0x3f < bVar10) {
          bVar10 = 0x40;
        }
        puVar1[lVar7] = bVar10;
        lVar7 = lVar7 + 1;
        uVar5 = uVar5 + iVar4 * iVar3;
      } while (lVar7 != 0x100);
      puVar1 = puVar1 + 0x100;
      iVar9 = iVar9 + 1;
      uVar8 = uVar8 - 0x100;
    } while (iVar9 != 0x20);
    lVar6 = lVar6 + 1;
    iVar2 = iVar2 + -2;
    iVar3 = iVar3 + -1;
  } while (lVar6 != 0x10);
  lVar6 = 0;
  do {
    if (0x40 < (byte)(&shadetables)[lVar6]) {
      __assert_fail("shadetables[i] <= 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_draw.cpp"
                    ,0xa8,"void swrenderer::R_InitShadeMaps()");
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20000);
  lVar6 = 0;
  do {
    (&identitymap)[lVar6] = (char)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  identitycolormap = &identitymap;
  return;
}

Assistant:

void R_InitShadeMaps()
	{
		int i, j;
		// set up shading tables for shaded columns
		// 16 colormap sets, progressing from full alpha to minimum visible alpha

		uint8_t *table = shadetables;

		// Full alpha
		for (i = 0; i < 16; ++i)
		{
			ShadeFakeColormap[i].Color = ~0u;
			ShadeFakeColormap[i].Desaturate = ~0u;
			ShadeFakeColormap[i].Next = NULL;
			ShadeFakeColormap[i].Maps = table;

			for (j = 0; j < NUMCOLORMAPS; ++j)
			{
				int a = (NUMCOLORMAPS - j) * 256 / NUMCOLORMAPS * (16 - i);
				for (int k = 0; k < 256; ++k)
				{
					uint8_t v = (((k + 2) * a) + 256) >> 14;
					table[k] = MIN<uint8_t>(v, 64);
				}
				table += 256;
			}
		}
		for (i = 0; i < NUMCOLORMAPS * 16 * 256; ++i)
		{
			assert(shadetables[i] <= 64);
		}

		// Set up a guaranteed identity map
		for (i = 0; i < 256; ++i)
		{
			identitymap[i] = i;
		}
		identitycolormap.Maps = identitymap;
	}